

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DES.cpp
# Opt level: O0

void __thiscall QMT::DES::handle_data(DES *this,uint *left,int choice)

{
  uint uVar1;
  int local_44;
  int local_40;
  int l;
  int i;
  uint tmpbuf [2];
  uint tmp;
  uint *right;
  uint local_20;
  int j;
  int number;
  int choice_local;
  uint *left_local;
  DES *this_local;
  
  register0x00000000 = left + 1;
  tmpbuf[0] = 0;
  memset(&l,0,8);
  for (local_40 = 0; local_40 < 0x40; local_40 = local_40 + 1) {
    if (local_40 < 0x20) {
      if (this->wz_pc1[local_40] < '!') {
        if ((this->wz_pc2[this->wz_pc1[local_40] + -1] & *left) != 0) {
          l = this->wz_pc2[local_40] | l;
        }
      }
      else if ((this->wz_pc2[this->wz_pc1[local_40] + -1] & *stack0xffffffffffffffd0) != 0) {
        l = this->wz_pc2[local_40] | l;
      }
    }
    else if (this->wz_pc1[local_40] < '!') {
      if ((this->wz_pc2[this->wz_pc1[local_40] + -1] & *left) != 0) {
        i = this->wz_pc2[local_40] | i;
      }
    }
    else if ((this->wz_pc2[this->wz_pc1[local_40] + -1] & *stack0xffffffffffffffd0) != 0) {
      i = this->wz_pc2[local_40] | i;
    }
  }
  *left = l;
  *stack0xffffffffffffffd0 = i;
  l = 0;
  i = 0;
  if (choice == 0) {
    for (local_20 = 0; (int)local_20 < 0x10; local_20 = local_20 + 1) {
      makedata(this,left,stack0xffffffffffffffd0,local_20);
    }
  }
  else if (choice == 1) {
    for (local_20 = 0xf; -1 < (int)local_20; local_20 = local_20 - 1) {
      makedata(this,left,stack0xffffffffffffffd0,local_20);
    }
  }
  uVar1 = *left;
  *left = *stack0xffffffffffffffd0;
  *stack0xffffffffffffffd0 = uVar1;
  for (local_44 = 0; local_44 < 0x40; local_44 = local_44 + 1) {
    if (local_44 < 0x20) {
      if (this->wz_pc4[local_44] < '!') {
        if ((this->wz_pc2[this->wz_pc4[local_44] + -1] & *left) != 0) {
          l = this->wz_pc2[local_44] | l;
        }
      }
      else if ((this->wz_pc2[this->wz_pc4[local_44] + -1] & *stack0xffffffffffffffd0) != 0) {
        l = this->wz_pc2[local_44] | l;
      }
    }
    else if (this->wz_pc4[local_44] < '!') {
      if ((this->wz_pc2[this->wz_pc4[local_44] + -1] & *left) != 0) {
        i = this->wz_pc2[local_44] | i;
      }
    }
    else if ((this->wz_pc2[this->wz_pc4[local_44] + -1] & *stack0xffffffffffffffd0) != 0) {
      i = this->wz_pc2[local_44] | i;
    }
  }
  *left = l;
  *stack0xffffffffffffffd0 = i;
  return;
}

Assistant:

void DES::handle_data(unsigned int *left , int choice)
  {
  	int  number = 0 ,j = 0;
  	unsigned int *right = &left[1];
  	unsigned int tmp = 0;
  	unsigned int tmpbuf[2] = { 0 };

  	for ( int i = 0; i < 64; ++i )
     {
       if ( i >= 32 )
       {
         if ( wz_pc1[i] <= 32 )
         {
           if ( wz_pc2[wz_pc1[i] - 1] & *left )
             tmpbuf[1] |= wz_pc2[i];
         }
         else if ( wz_pc2[wz_pc1[i] - 1] & *right )
         {
           tmpbuf[1] |= wz_pc2[i];
         }
       }
       else if ( wz_pc1[i] <= 32 )
       {
         if ( wz_pc2[wz_pc1[i] - 1] & *left )
           tmpbuf[0] |= wz_pc2[i];
       }
       else if ( wz_pc2[wz_pc1[i] - 1] & *right )
       {
         tmpbuf[0] |= wz_pc2[i];
       }
     }
  	*left  = tmpbuf[0];
  	*right = tmpbuf[1];
  	tmpbuf[0] = 0;
  	tmpbuf[1] = 0;
      switch(choice )
  	{
  		case DESENCRY:
  			for (number = 0; number < 16; number++)
  			{
  				makedata(left , right , (unsigned long)number);
  			}
  			break;
  		case DESDECRY:
  			for (number = 15; number >= 0; number--)
  			{
  				makedata(left , right ,(unsigned long)number);
  			}
  			break;
  		default:
  			break;
  	}

  	tmp = *left;
  	*left = *right;
  	*right = tmp;
  	for ( int l = 0; l < 64; ++l )
    {
      if ( l >= 32 )
      {
        if ( wz_pc4[l] <= 32 )
        {
          if ( wz_pc2[wz_pc4[l] - 1] & *left )
            tmpbuf[1] |= wz_pc2[l];
        }
        else if ( wz_pc2[wz_pc4[l] - 1] & *right )
        {
          tmpbuf[1] |= wz_pc2[l];
        }
      }
      else if ( wz_pc4[l] <= 32 )
      {
        if ( wz_pc2[wz_pc4[l] - 1] & *left )
          tmpbuf[0] |= wz_pc2[l];
      }
      else if ( wz_pc2[wz_pc4[l] - 1] & *right )
      {
        tmpbuf[0] |= wz_pc2[l];
      }
    }

  	*left =  tmpbuf[0];
  	*right = tmpbuf[1];
  }